

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O0

int raviX_ptrlist_size(PtrList *self)

{
  PtrList *local_20;
  PtrList *list;
  int nr;
  PtrList *self_local;
  
  list._4_4_ = 0;
  local_20 = self;
  if (self != (PtrList *)0x0) {
    do {
      list._4_4_ = ((int)(short)(char)*(short *)local_20 - (int)(*(short *)local_20 >> 8)) +
                   list._4_4_;
      local_20 = local_20->next_;
    } while (local_20 != self);
  }
  return list._4_4_;
}

Assistant:

int raviX_ptrlist_size(const PtrList *self)
{
	int nr = 0;
	if (self) {
		const PtrList *list = self;
		do {
			nr += list->nr_ - list->rm_;
		} while ((list = list->next_) != self);
	}
	return nr;
}